

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_sorted.c
# Opt level: O3

void rb_insert_node(rb_node **rbt,rb_node *rbn,ly_bool *max_p)

{
  rb_node *prVar1;
  int iVar2;
  rb_node *prVar3;
  rb_node *prVar4;
  ly_bool lVar5;
  rb_node *prVar6;
  rb_node **pprVar7;
  rb_node **pprVar8;
  rb_node *prVar9;
  code *pcVar10;
  
  pcVar10 = rb_compare_lists;
  if ((*rbt)->dnode->schema->nodetype == 8) {
    pcVar10 = rb_compare_leaflists;
  }
  lVar5 = '\x01';
  prVar1 = *rbt;
  do {
    prVar9 = prVar1;
    iVar2 = (*pcVar10)(prVar9->dnode,rbn->dnode);
    if (0 < iVar2) {
      lVar5 = '\0';
    }
    prVar1 = (&prVar9->left)[iVar2 < 1];
  } while ((&prVar9->left)[iVar2 < 1] != (rb_node *)0x0);
  rbn->parent = prVar9;
  rbn->left = (rb_node *)0x0;
  rbn->right = (rb_node *)0x0;
  rbn->color = '\x01';
  (&prVar9->left)[iVar2 < 1] = rbn;
  do {
    if (prVar9->color != '\x01') break;
    prVar1 = prVar9->parent;
    prVar4 = prVar1->left;
    pprVar8 = rbt;
    if (prVar9 == prVar4) {
      prVar3 = prVar1->right;
      if ((prVar3 != (rb_node *)0x0) && (prVar3->color == '\x01')) {
        prVar3->color = '\0';
        goto LAB_0015501f;
      }
      prVar3 = prVar9->right;
      prVar6 = prVar9;
      if (prVar3 == rbn) {
        prVar4 = prVar3->left;
        prVar9->right = prVar4;
        if (prVar4 == (rb_node *)0x0) {
          prVar3->parent = prVar1;
          prVar4 = prVar1;
LAB_001550ff:
          pprVar7 = &prVar4->left + (prVar6 != prVar9);
        }
        else {
          prVar4->parent = prVar9;
          prVar4 = prVar9->parent;
          prVar3->parent = prVar4;
          pprVar7 = rbt;
          if (prVar4 != (rb_node *)0x0) {
            prVar6 = prVar4->left;
            goto LAB_001550ff;
          }
        }
        *pprVar7 = prVar3;
        prVar3->left = prVar9;
        prVar9->parent = prVar3;
        prVar4 = prVar1->left;
        prVar6 = rbn;
        rbn = prVar9;
      }
      prVar6->color = '\0';
      prVar1->color = '\x01';
      prVar9 = prVar4->right;
      prVar1->left = prVar9;
      if (prVar9 != (rb_node *)0x0) {
        prVar9->parent = prVar1;
      }
      prVar9 = prVar1->parent;
      prVar4->parent = prVar9;
      if (prVar9 != (rb_node *)0x0) {
        pprVar8 = &prVar9->right;
        if (prVar9->left == prVar1) {
          pprVar8 = &prVar9->left;
        }
      }
      pprVar7 = &prVar4->right;
LAB_0015515d:
      *pprVar8 = prVar4;
      *pprVar7 = prVar1;
      prVar1->parent = prVar4;
    }
    else {
      if ((prVar4 == (rb_node *)0x0) || (prVar4->color != '\x01')) {
        prVar4 = prVar9->left;
        prVar3 = prVar9;
        if (prVar4 == rbn) {
          prVar3 = prVar4->right;
          prVar9->left = prVar3;
          if (prVar3 == (rb_node *)0x0) {
            prVar4->parent = prVar1;
            prVar3 = prVar1;
LAB_00155098:
            pprVar7 = &prVar3->right;
            if (prVar3->left == prVar9) {
              pprVar7 = &prVar3->left;
            }
          }
          else {
            prVar3->parent = prVar9;
            prVar3 = prVar9->parent;
            prVar4->parent = prVar3;
            pprVar7 = rbt;
            if (prVar3 != (rb_node *)0x0) goto LAB_00155098;
          }
          *pprVar7 = prVar4;
          prVar4->right = prVar9;
          prVar9->parent = prVar4;
          prVar3 = rbn;
          rbn = prVar9;
        }
        prVar3->color = '\0';
        prVar1->color = '\x01';
        prVar4 = prVar1->right;
        prVar9 = prVar4->left;
        prVar1->right = prVar9;
        if (prVar9 != (rb_node *)0x0) {
          prVar9->parent = prVar1;
        }
        prVar9 = prVar1->parent;
        prVar4->parent = prVar9;
        if (prVar9 != (rb_node *)0x0) {
          pprVar8 = &prVar9->right;
          if (prVar9->left == prVar1) {
            pprVar8 = &prVar9->left;
          }
        }
        pprVar7 = &prVar4->left;
        goto LAB_0015515d;
      }
      prVar4->color = '\0';
LAB_0015501f:
      prVar9->color = '\0';
      prVar1->color = '\x01';
      rbn = prVar1;
    }
    prVar9 = rbn->parent;
  } while (prVar9 != (rb_node *)0x0);
  (*rbt)->color = '\0';
  if (max_p != (ly_bool *)0x0) {
    *max_p = lVar5;
  }
  return;
}

Assistant:

static void
rb_insert_node(struct rb_node **rbt, struct rb_node *rbn, ly_bool *max_p)
{
    ly_bool max;
    struct rb_node *tmp;
    struct rb_node *parent = NULL;
    int comp = 0;

    int (*rb_compare)(const struct lyd_node *n1, const struct lyd_node *n2);

    if (RBN_DNODE(*rbt)->schema->nodetype == LYS_LEAFLIST) {
        rb_compare = rb_compare_leaflists;
    } else {
        rb_compare = rb_compare_lists;
    }

    max = 1;
    tmp = *rbt;
    while (tmp != NULL) {
        parent = tmp;

        comp = rb_compare(RBN_DNODE(tmp), RBN_DNODE(rbn));
        if (comp > 0) {
            tmp = RBN_LEFT(tmp);
            max = 0;
        } else {
            tmp = RBN_RIGHT(tmp);
        }
    }

    rb_set(rbn, parent);

    if (parent != NULL) {
        if (comp > 0) {
            RBN_LEFT(parent) = rbn;
        } else {
            RBN_RIGHT(parent) = rbn;
        }
    } else {
        *rbt = rbn;
    }

    rb_insert_color(rbt, rbn);

    if (max_p) {
        *max_p = max;
    }
}